

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::FindNextProperty
          (DictionaryTypeHandlerBase<unsigned_short> *this,ScriptContext *scriptContext,
          PropertyIndex *index,JavascriptString **propertyStringName,PropertyId *propertyId,
          PropertyAttributes *attributes,Type *type,DynamicType *typeToEnumerate,
          EnumeratorFlags flags,DynamicObject *instance,PropertyValueInfo *info)

{
  PropertyIndex PVar1;
  PropertyId propertyId_00;
  DictionaryPropertyDescriptor<unsigned_short> DVar2;
  PropertyRecord *pPVar3;
  code *pcVar4;
  bool bVar5;
  unsigned_short uVar6;
  undefined4 *puVar7;
  DictionaryPropertyDescriptor<unsigned_short> *pDVar8;
  PropertyRecord **ppPVar9;
  PropertyString *this_00;
  PolymorphicInlineCache *polymorphicInlineCache;
  PropertyRecordUsageCache *propertyRecordUsageCache;
  uint index_00;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  ulong uVar10;
  DictionaryPropertyDescriptor<unsigned_short> local_38;
  DictionaryPropertyDescriptor<unsigned_short> descriptor;
  
  if (propertyStringName == (JavascriptString **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x70,"(propertyStringName)","propertyStringName");
    if (!bVar5) goto LAB_00d953c1;
    *puVar7 = 0;
  }
  if (propertyId == (PropertyId *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x71,"(propertyId)","propertyId");
    if (!bVar5) goto LAB_00d953c1;
    *puVar7 = 0;
  }
  if (type == (Type *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x72,"(type)","type");
    if (!bVar5) {
LAB_00d953c1:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar7 = 0;
  }
  index_00 = (uint)*index;
  this_01 = (this->propertyMap).ptr;
  if ((int)(uint)*index < this_01->count - this_01->freeCount) {
    do {
      pDVar8 = JsUtil::
               BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::GetValueAt(this_01,index_00);
      DVar2 = *pDVar8;
      uVar10 = (ulong)DVar2 >> 8;
      local_38 = DVar2;
      if ((((uVar10 & 8) == 0) &&
          (((flags & EnumNonEnumerable) != None || (((ulong)DVar2 & 0x100) != 0)))) &&
         (((uVar10 & 0x10) == 0 ||
          (((byte)((uVar10 & 0xffffffff) >> 4) & 0xf & ((ulong)DVar2 & 2) == 0) == 0)))) {
        ppPVar9 = JsUtil::
                  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  ::GetKeyAt((this->propertyMap).ptr,(uint)*index);
        pPVar3 = *ppPVar9;
        if (((flags & EnumSymbols) != None) || (pPVar3->isSymbol == false)) {
          if (attributes != (PropertyAttributes *)0x0) {
            *attributes = DVar2.Attributes;
          }
          propertyId_00 = pPVar3->pid;
          *propertyId = propertyId_00;
          this_00 = ScriptContext::GetPropertyString(scriptContext,propertyId_00);
          *propertyStringName = &this_00->super_JavascriptString;
          uVar6 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<false>
                            (&local_38);
          if ((((DynamicType *)type == typeToEnumerate) && (((ulong)DVar2 & 0x400) != 0)) &&
             (uVar6 != 0xffff)) {
            polymorphicInlineCache = PropertyString::GetLdElemInlineCache(this_00);
            propertyRecordUsageCache = PropertyString::GetPropertyRecordUsageCache(this_00);
            PropertyValueInfo::SetCacheInfo
                      (info,(RecyclableObject *)this_00,propertyRecordUsageCache,
                       polymorphicInlineCache,false);
            if (info == (PropertyValueInfo *)0x0) {
              return 1;
            }
            info->m_instance = &instance->super_RecyclableObject;
            info->m_propertyIndex = uVar6;
            info->m_attributes = local_38.Attributes;
            info->flags = InlineCacheNoFlags;
            if ((local_38.flags & (IsFixed|IsInitialized)) != IsInitialized) {
              *(undefined1 *)&info->cacheInfoFlag = (char)info->cacheInfoFlag & 0xfb;
            }
            if (((ulong)local_38 & 0x800) == 0) {
              return 1;
            }
            info->m_instance = &instance->super_RecyclableObject;
            info->m_propertyIndex = 0xffff;
            info->m_attributes = '\0';
          }
          else {
            if (info == (PropertyValueInfo *)0x0) {
              return 1;
            }
            info->m_instance = &instance->super_RecyclableObject;
            info->m_propertyIndex = 0xffff;
            info->m_attributes = '\0';
          }
          info->flags = InlineCacheNoFlags;
          return 1;
        }
      }
      PVar1 = *index;
      *index = PVar1 + 1;
      index_00 = (uint)(ushort)(PVar1 + 1);
      this_01 = (this->propertyMap).ptr;
    } while ((int)index_00 < this_01->count - this_01->freeCount);
  }
  if (info != (PropertyValueInfo *)0x0) {
    info->m_instance = &instance->super_RecyclableObject;
    info->m_propertyIndex = 0xffff;
    info->m_attributes = '\0';
    info->flags = InlineCacheNoFlags;
  }
  return 0;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::FindNextProperty(ScriptContext* scriptContext, PropertyIndex& index, JavascriptString** propertyStringName,
        PropertyId* propertyId, PropertyAttributes* attributes, Type* type, DynamicType *typeToEnumerate, EnumeratorFlags flags, DynamicObject* instance, PropertyValueInfo* info)
    {
        Assert(propertyStringName);
        Assert(propertyId);
        Assert(type);

        for (; index < propertyMap->Count(); ++index)
        {
            DictionaryPropertyDescriptor<T> descriptor = propertyMap->GetValueAt(index);
            PropertyAttributes attribs = descriptor.Attributes;

            if (!(attribs & PropertyDeleted) && (!!(flags & EnumeratorFlags::EnumNonEnumerable) || (attribs & PropertyEnumerable)) &&
                (!(attribs & PropertyLetConstGlobal) || descriptor.HasNonLetConstGlobal()))
            {
                const PropertyRecord* propertyRecord = propertyMap->GetKeyAt(index);

                // Skip this property if it is a symbol and we are not including symbol properties
                if (!(flags & EnumeratorFlags::EnumSymbols) && propertyRecord->IsSymbol())
                {
                    continue;
                }

                // Pass back attributes of this property so caller can use them if it needs
                if (attributes != nullptr)
                {
                    *attributes = attribs;
                }

                *propertyId = propertyRecord->GetPropertyId();
                PropertyString* propertyString = scriptContext->GetPropertyString(*propertyId);
                *propertyStringName = propertyString;
                T dataSlot = descriptor.template GetDataPropertyIndex<false>();
                if (dataSlot != NoSlots && (attribs & PropertyWritable) && type == typeToEnumerate)
                {
                    PropertyValueInfo::SetCacheInfo(info, propertyString, propertyString->GetLdElemInlineCache(), false);
                    SetPropertyValueInfo(info, instance, dataSlot, &descriptor);
                }
                else
                {
                    PropertyValueInfo::SetNoCache(info, instance);
                }
                return TRUE;
            }
        }
        PropertyValueInfo::SetNoCache(info, instance);

        return FALSE;
    }